

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

bool __thiscall QXmlStreamReaderPrivate::scanPublicOrSystem(QXmlStreamReaderPrivate *this)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  char **ppcVar4;
  short tokenToInject;
  
  lVar1 = (this->putStack).tos;
  if (lVar1 == -1) {
    if (this->readBufferPos < (this->readBuffer).d.size) {
      uVar3 = (uint)(ushort)(this->readBuffer).d.ptr[this->readBufferPos];
    }
    else {
      uVar3 = getChar_helper(this);
      if (uVar3 == 0xffffffff) {
        return false;
      }
      this->readBufferPos = this->readBufferPos + -1;
    }
  }
  else {
    uVar3 = (this->putStack).data[lVar1];
  }
  if (uVar3 == 0x53) {
    ppcVar4 = QXmlStreamGrammar::spell + 0x22;
    tokenToInject = 0x22;
  }
  else {
    if (uVar3 != 0x50) {
      return false;
    }
    ppcVar4 = QXmlStreamGrammar::spell + 0x23;
    tokenToInject = 0x23;
  }
  bVar2 = scanString(this,*ppcVar4,tokenToInject,true);
  return bVar2;
}

Assistant:

bool QXmlStreamReaderPrivate::scanPublicOrSystem()
{
    switch (peekChar()) {
    case 'S':
        return scanString(spell[SYSTEM], SYSTEM);
    case 'P':
        return scanString(spell[PUBLIC], PUBLIC);
    default:
        ;
    }
    return false;
}